

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sovr.h
# Opt level: O1

vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
* sovr(vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
       *__return_storage_ptr__,int c,int r,
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      *mcurrent,vector<float,_std::allocator<float>_> *x,int m)

{
  int iVar1;
  pointer pvVar2;
  pointer pfVar3;
  pointer pfVar4;
  pointer pvVar5;
  ostream *poVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  char *pcVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  float *pfVar14;
  ulong uVar15;
  bool bVar16;
  float fVar17;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *current;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  temp;
  ofstream file_stream;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_248;
  long local_230;
  filebuf local_228 [24];
  byte abStack_210 [216];
  ios_base local_138 [264];
  
  makeMatrix(&local_248,r,c);
  uVar15 = (ulong)(uint)r;
  if (2 < c) {
    iVar7 = 1;
    do {
      if (0 < r) {
        pvVar2 = (mcurrent->
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar12 = 0;
        do {
          pfVar3 = (x->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pfVar4 = local_248.
                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar12].
                   super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
                   ._M_start;
          lVar11 = *(long *)&pvVar2[uVar12].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data;
          uVar9 = 0;
          do {
            iVar1 = *(int *)(lVar11 + (long)iVar7 * 4 + uVar9 * 4);
            if (iVar1 == -1) {
              fVar17 = -pfVar3[iVar7 / r];
            }
            else {
              fVar17 = 0.0;
              if (iVar1 == 1) {
                fVar17 = pfVar3[iVar7 / r];
              }
            }
            pfVar4[(long)iVar7 + uVar9] = fVar17;
            uVar9 = uVar9 + 1;
          } while (uVar15 != uVar9);
          uVar12 = uVar12 + 1;
        } while (uVar12 != uVar15);
      }
      iVar7 = iVar7 + r + 1;
    } while (iVar7 < c + -1);
  }
  if (0 < r) {
    uVar12 = 0;
    do {
      lVar13 = 0;
      lVar11 = uVar15 * 4;
      do {
        lVar11 = lVar11 + 4;
        if (1 < m) {
          pfVar3 = local_248.
                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar12].
                   super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
                   ._M_start;
          fVar17 = pfVar3[lVar13];
          pfVar14 = (float *)((long)pfVar3 + lVar11);
          lVar8 = (ulong)(uint)m - 1;
          do {
            fVar17 = fVar17 + *pfVar14;
            pfVar14 = pfVar14 + uVar15 + 1;
            lVar8 = lVar8 + -1;
          } while (lVar8 != 0);
          pfVar3[lVar13] = fVar17;
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 != uVar15 + 1);
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar15);
  }
  makeMatrix(__return_storage_ptr__,r,r);
  if (0 < r) {
    pvVar5 = (__return_storage_ptr__->
             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar12 = 0;
    do {
      pfVar3 = local_248.
               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar12].
               super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
               _M_start;
      lVar11 = *(long *)&pvVar5[uVar12].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data;
      uVar9 = 0;
      do {
        *(float *)(lVar11 + uVar9 * 4) = pfVar3[uVar9 + 1];
        uVar9 = uVar9 + 1;
      } while (uVar15 != uVar9);
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar15);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\nComputed currents fit the law of nodes\n",0x28);
  if (0 < r) {
    pvVar5 = (__return_storage_ptr__->
             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar12 = 0;
    do {
      lVar11 = *(long *)&pvVar5[uVar12].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data;
      uVar9 = 0;
      do {
        if (*(float *)(lVar11 + uVar9 * 4) <= 0.0) {
          *(undefined4 *)(lVar11 + uVar9 * 4) = 0;
        }
        uVar9 = uVar9 + 1;
      } while (uVar15 != uVar9);
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar15);
  }
  std::ofstream::ofstream(&local_230,"current.dat",_S_out);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,
             "The current matrix stores the currents between nodes in the circuit.\n",0x45);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,
             "Entry with (row, column) indexes (A, B) identifies a current flowing from node A to node B, while the corresponding (B, A) entry is empty.\n"
             ,0x8b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"Current matrix: \n",0x11);
  if (0 < r) {
    uVar12 = 0;
    do {
      if (r != 1) {
        uVar9 = 0;
        do {
          poVar6 = std::ostream::_M_insert<double>
                             ((double)*(float *)(*(long *)&(__return_storage_ptr__->
                                                                                                                      
                                                  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start[uVar12]
                                                  .super__Vector_base<float,_std::allocator<float>_>
                                                  ._M_impl.super__Vector_impl_data + uVar9 * 4));
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\t",1);
          uVar9 = uVar9 + 1;
        } while (r - 1U != uVar9);
      }
      poVar6 = std::ostream::_M_insert<double>
                         ((double)*(float *)(*(long *)&(__return_storage_ptr__->
                                                                                                              
                                                  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start[uVar12]
                                                  .super__Vector_base<float,_std::allocator<float>_>
                                                  ._M_impl.super__Vector_impl_data +
                                            (long)(int)(r - 1U) * 4));
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar15);
  }
  bVar16 = (abStack_210[*(long *)(local_230 + -0x18)] & 5) == 0;
  pcVar10 = "Error in writing file current.data\n";
  if (bVar16) {
    pcVar10 = "File current.dat has been written\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,pcVar10,(ulong)bVar16 ^ 0x23);
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&local_248);
  return __return_storage_ptr__;
}

Assistant:

auto sovr(int c, int r, std::vector<std::vector<int> > &mcurrent, std::vector<float> &x, int m)
{
    int i, j, k, n;
    using std::vector;
    auto temp = makeMatrix(r, c);
    float sum;

    // multiply the  temp matrix by the values of the mesh currents in each individual mesh
    for (k = 1; k < c-1; k = k + r + 1)
    {
        for ( i = 0; i < r; i++)
        {
            for (j = 0; j < r; j++)
            {
                if(mcurrent[i][j+k] == 1)
                {
                    temp[i][j+k] = x[k/r];
                } else if (mcurrent[i][j+k] == -1)
                {
                    temp[i][j+k] = -x[k/r];
                } else
                {
                    temp[i][j+k] = 0;
                }

            }
        }
    }

    for (i = 0; i < r; i++)
    {
        for (j = 0; j < r + 1 ; j++)
        {
            for (k = 1; k < m; k++)
            {
                temp[i][j] +=  + temp[i][j+k*(r+1)];
            }
        }
    }

    auto current = makeMatrix(r, r);

    for (i = 0; i < r; i++)
    {
        for (j = 0; j < r; j++)
        {
            current[i][j] = temp[i][j+1];
        }
    }

    //Check that the results are correct by applying the law of nodes (and angles)
    // note that the law of the nodes is verified if the sum of the terms on each row is 0 (4.d.p)
    k = 0;
    for (i = 0; i < r; i++)
    {
        sum = 0;
        for (j = 0; j < r; j++)
        {
            sum += current[i][j];
        }
        if (sum >= 0.0001 && sum <= -0.0001)
        {
            std::cout << "\n There was an error while calculating currents\n";
            k = 1;
            break;
        }
    }
    if(k==0)
    {
        std::cout << "\nComputed currents fit the law of nodes\n";
    }

    for (i = 0; i < r; i++)
    {
        for (j = 0; j < r; j++)
        {
            if (current[i][j] <= 0)
            {
                current[i][j] = 0;
            }
        }
    }

    std::ofstream file_stream("current.dat");
    file_stream << "The current matrix stores the currents between nodes in the circuit.\n";
    file_stream << "Entry with (row, column) indexes (A, B) identifies a current flowing from node A to node B, while the corresponding (B, A) entry is empty.\n";
    file_stream << "Current matrix: \n";

    for (i = 0; i < r; i++)
    {
        for (j = 0; j < r - 1; j++)
        {
            file_stream << current[i][j] << "\t";
        }
        file_stream << current[i][r-1] << "\n";
    }

    if (!file_stream)
    {
        std::cout << "Error in writing file current.data\n";
    } else {
        std::cout << "File current.dat has been written\n";
    }

    return current;
}